

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzNegMod(word *b,word *a,word *mod,size_t n)

{
  bool_t bVar1;
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word mask;
  
  zzSub(in_RDI,in_RDX,in_RSI,in_RCX);
  bVar1 = wwEq(in_RDI,in_RDX,in_RCX);
  zzSubAndW(in_RDI,in_RDX,in_RCX,-(long)bVar1);
  return;
}

Assistant:

void SAFE(zzNegMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word mask;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0);
	// b <- mod - a
	zzSub(b, mod, a, n);
	// mask <- b == mod ? WORD_MAX : WORD_0
	mask = WORD_0 - (word)wwEq(b, mod, n);
	// b <- b - mod & mask
	zzSubAndW(b, mod, n, mask);
	mask = 0;
}